

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::ListOp<tinyusdz::Path>::ClearAndMakeExplicit(ListOp<tinyusdz::Path> *this)

{
  ListOp<tinyusdz::Path> *this_local;
  
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::clear(&this->explicit_items);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::clear(&this->added_items);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::clear(&this->prepended_items);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::clear(&this->appended_items);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::clear(&this->deleted_items);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::clear(&this->ordered_items);
  this->is_explicit = true;
  return;
}

Assistant:

void ClearAndMakeExplicit() {
    explicit_items.clear();
    added_items.clear();
    prepended_items.clear();
    appended_items.clear();
    deleted_items.clear();
    ordered_items.clear();

    is_explicit = true;
  }